

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

bool __thiscall
ON_DimStyle::Internal_SetBoolMember(ON_DimStyle *this,field field_id,bool value,bool *class_member)

{
  bool bVar1;
  bool bVar2;
  bool b;
  bool bValueChanged;
  bool *class_member_local;
  bool value_local;
  field field_id_local;
  ON_DimStyle *this_local;
  
  bVar1 = (bool)(-value & 1);
  bVar2 = bVar1 != (bool)(*class_member & 1U);
  if (bVar2) {
    *class_member = bVar1;
    Internal_ContentChange(this);
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,field_id);
  return bVar2;
}

Assistant:

bool ON_DimStyle::Internal_SetBoolMember(
  ON_DimStyle::field field_id,
  bool value,
  bool& class_member
)
{
  bool bValueChanged = false;
  const bool b = value ? true : false;
  if (b != class_member)
  {
    class_member = b;
    Internal_ContentChange();
    bValueChanged = true;
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(field_id);
  return bValueChanged;
}